

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.cpp
# Opt level: O0

void err_cb(exr_const_context_t f,exr_result_t code,char *msg)

{
  ostream *poVar1;
  char *pcVar2;
  char *in_RDX;
  int in_ESI;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"err_cb ");
  pcVar2 = (char *)exr_get_error_code_as_string(in_ESI);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ESI);
  poVar1 = std::operator<<(poVar1,"): ");
  poVar1 = std::operator<<(poVar1,in_RDX);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

static void
err_cb (exr_const_context_t f, int code, const char* msg)
{
    std::cerr << "err_cb ERROR " << code << ": " << msg << std::endl;
}